

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::added2Set(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *set,
           SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *addset,int n)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  Item *pIVar5;
  int *piVar6;
  DataKey *pDVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar13;
  ulong uVar14;
  int iVar15;
  byte bVar16;
  int *local_40;
  undefined8 local_38;
  
  bVar16 = 0;
  if (n != 0) {
    iVar4 = (set->set).thenum;
    local_40 = (int *)0x0;
    local_38 = 0x3ff3333333333333;
    iVar15 = 0;
    iVar3 = iVar4;
    if (iVar4 < 1) {
      iVar3 = 0;
    }
    iVar10 = 1;
    if (0 < iVar4) {
      iVar10 = iVar3;
    }
    spx_alloc<int*>(&local_40,iVar10);
    piVar2 = local_40;
    lVar9 = (long)(set->set).thenum;
    if (0 < lVar9) {
      memset(local_40,0,lVar9 << 2);
    }
    if (0 < n) {
      iVar4 = (addset->set).thenum;
      pIVar5 = (addset->set).theitem;
      pDVar7 = (addset->set).thekey;
      lVar9 = (long)(iVar4 - n);
      iVar15 = 0;
      do {
        iVar3 = pDVar7[lVar9].idx;
        iVar10 = pIVar5[iVar3].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        lVar12 = (long)iVar10;
        if (0 < lVar12) {
          uVar14 = lVar12 + 1;
          piVar11 = &pIVar5[iVar3].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem[lVar12 + -1].idx;
          do {
            piVar2[*piVar11] = piVar2[*piVar11] + 1;
            uVar14 = uVar14 - 1;
            piVar11 = piVar11 + -0x21;
          } while (1 < uVar14);
        }
        iVar15 = iVar15 + iVar10;
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar4);
    }
    if ((set->
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ).themax < iVar15) {
      SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::memRemax(set,iVar15);
    }
    lVar9 = (long)(set->set).thenum;
    if (0 < lVar9) {
      pIVar5 = (set->set).theitem;
      pDVar7 = (set->set).thekey;
      uVar14 = lVar9 + 1;
      do {
        iVar4 = pIVar5[pDVar7[uVar14 - 2].idx].data.
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused;
        SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::xtend(set,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)(pIVar5 + pDVar7[uVar14 - 2].idx),piVar2[uVar14 - 2] + iVar4);
        pIVar5 = (set->set).theitem;
        pDVar7 = (set->set).thekey;
        pIVar5[pDVar7[uVar14 - 2].idx].data.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .memused = piVar2[uVar14 - 2] + iVar4;
        piVar2[uVar14 - 2] = iVar4;
        uVar14 = uVar14 - 1;
      } while (1 < uVar14);
    }
    if (0 < n) {
      iVar4 = (addset->set).thenum;
      lVar9 = (long)(iVar4 - n);
      do {
        pIVar5 = (addset->set).theitem;
        iVar3 = (addset->set).thekey[lVar9].idx;
        lVar12 = (long)pIVar5[iVar3].data.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused;
        if (0 < lVar12) {
          uVar14 = lVar12 + 1;
          lVar12 = lVar12 * 0x84 + -4;
          do {
            piVar6 = (int *)((long)&((pIVar5[iVar3].data.
                                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     .m_elem)->val).m_backend.data + lVar12);
            iVar4 = *piVar6;
            iVar15 = piVar2[iVar4];
            piVar2[iVar4] = iVar15 + 1;
            pNVar1 = (set->set).theitem[(set->set).thekey[iVar4].idx].data.
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem;
            pNVar1[iVar15].idx = (int)lVar9;
            piVar11 = piVar6 + -0x20;
            pNVar13 = pNVar1 + iVar15;
            for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
              *(int *)&(pNVar13->val).m_backend.data = *piVar11;
              piVar11 = piVar11 + (ulong)bVar16 * -2 + 1;
              pNVar13 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)((long)pNVar13 + ((ulong)bVar16 * -2 + 1) * 4);
            }
            pNVar1[iVar15].val.m_backend.exp = piVar6[-4];
            pNVar1[iVar15].val.m_backend.neg = SUB41(piVar6[-3],0);
            iVar4 = piVar6[-1];
            pNVar1[iVar15].val.m_backend.fpclass = piVar6[-2];
            pNVar1[iVar15].val.m_backend.prec_elem = iVar4;
            uVar14 = uVar14 - 1;
            lVar12 = lVar12 + -0x84;
          } while (1 < uVar14);
          iVar4 = (addset->set).thenum;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar4);
    }
    if (local_40 != (int *)0x0) {
      free(local_40);
    }
  }
  return;
}

Assistant:

void added2Set(SVSetBase<R>& set, const SVSetBase<R>& addset, int n)
   {

      if(n == 0)
         return;

      DataArray<int> moreArray(set.num());
      int* more = moreArray.get_ptr();

      for(int i = set.num() - 1; i >= 0; --i)
         more[i] = 0;

      int tot = 0;
      int end = addset.num();

      for(int i = addset.num() - n; i < end; ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         tot += vec.size();

         for(int j = vec.size() - 1; j >= 0; --j)
            more[vec.index(j)]++;
      }

      if(set.memMax() < tot)
         set.memRemax(tot);

      for(int i = set.num() - 1; i >= 0; --i)
      {
         int j = set[i].size();
         set.xtend(set[i], j + more[i]);
         set[i].set_size(j + more[i]);
         more[i] = j;
      }

      for(int i = addset.num() - n; i < addset.num(); ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         for(int j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            int m = more[k]++;
            SVectorBase<R>& l_xtend = set[k];
            l_xtend.index(m) = i;
            l_xtend.value(m) = vec.value(j);
         }
      }
   }